

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QItemSelectionRange>::reallocate
          (QMovableArrayOps<QItemSelectionRange> *this,qsizetype alloc,AllocationOption option)

{
  long lVar1;
  AllocationOption in_EDX;
  qsizetype in_RSI;
  QItemSelectionRange *in_RDI;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QItemSelectionRange>_*,_QItemSelectionRange_*> pVar2;
  pair<QTypedArrayData<QItemSelectionRange>_*,_QItemSelectionRange_*> pair;
  QItemSelectionRange *pQStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar2 = QTypedArrayData<QItemSelectionRange>::reallocateUnaligned
                    ((QTypedArrayData<QItemSelectionRange> *)&DAT_aaaaaaaaaaaaaaaa,in_RDI,in_RSI,
                     in_EDX);
  qt_noop();
  (in_RDI->tl).d = (QPersistentModelIndexData *)pVar2.first;
  pQStack_10 = pVar2.second;
  (in_RDI->br).d = (QPersistentModelIndexData *)pQStack_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }